

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_texture_npatch
               (rf_texture2d texture,rf_npatch_info n_patch_info,rf_rec dest_rec,rf_vec2 origin,
               float rotation,rf_color tint)

{
  undefined1 auVar1 [16];
  rf_npatch_info rVar2;
  undefined4 in_EDX;
  uint uVar3;
  float x;
  float y;
  float y_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float x_00;
  float x_01;
  float y_01;
  float fVar10;
  undefined1 auVar11 [16];
  float x_02;
  float y_02;
  float x_03;
  float fVar12;
  float x_04;
  float fVar13;
  float fVar14;
  float local_e8;
  float local_68;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  rVar2 = n_patch_info;
  if (texture.id == 0) {
    return;
  }
  x_00 = (float)(-(uint)(0.0 < dest_rec.width) & (uint)dest_rec.width);
  y_01 = (float)(-(uint)(0.0 < dest_rec.height) & (uint)dest_rec.height);
  if (n_patch_info.source_rec.width < 0.0) {
    n_patch_info.source_rec.x = n_patch_info.source_rec.x - n_patch_info.source_rec.width;
  }
  auVar4._0_4_ = -(uint)(n_patch_info.type == 1);
  auVar4._4_4_ = -(uint)(n_patch_info.type == 2);
  auVar4._8_4_ = 0xffffffff;
  auVar4._12_4_ = 0xffffffff;
  auVar1._4_4_ = y_01;
  auVar1._0_4_ = x_00;
  auVar1._8_4_ = -(uint)(0.0 < dest_rec.width) & (uint)dest_rec.width;
  auVar1._12_4_ = -(uint)(0.0 < dest_rec.height) & (uint)dest_rec.height;
  auVar11._0_4_ = (uint)n_patch_info.source_rec.width & auVar4._0_4_;
  auVar11._4_4_ = (uint)n_patch_info.source_rec.height & auVar4._4_4_;
  auVar11._8_8_ = 0;
  auVar11 = auVar11 | ~auVar4 & auVar1;
  x_02 = (float)rVar2.left;
  y_02 = (float)rVar2.top;
  fVar13 = (float)rVar2.right;
  local_68 = (float)rVar2.bottom;
  fVar10 = auVar11._0_4_;
  fVar8 = auVar11._4_4_;
  auVar9._4_4_ = -(uint)(y_02 + local_68 < fVar8);
  auVar9._0_4_ = -(uint)(x_02 + fVar13 < fVar10);
  auVar9._8_4_ = -(uint)(0.0 < auVar11._8_4_);
  auVar9._12_4_ = -(uint)(0.0 < auVar11._12_4_);
  auVar9 = auVar9 | auVar4;
  auVar5._0_8_ = auVar9._0_8_;
  auVar5._8_4_ = auVar9._4_4_;
  auVar5._12_4_ = auVar9._12_4_;
  auVar6._0_8_ = auVar5._0_8_ << 0x3f;
  auVar6._8_8_ = auVar5._8_8_ << 0x3f;
  uVar3 = movmskpd(in_EDX,auVar6);
  x_04 = x_02;
  if ((uVar3 & 1) == 0) {
    x_04 = (x_02 / (x_02 + fVar13)) * fVar10;
    fVar13 = fVar10 - x_04;
  }
  fVar7 = (float)texture.width;
  fVar14 = (float)texture.height;
  fVar12 = (float)(~-(uint)(n_patch_info.source_rec.height < 0.0) & (uint)n_patch_info.source_rec.y
                  | (uint)(n_patch_info.source_rec.y - n_patch_info.source_rec.height) &
                    -(uint)(n_patch_info.source_rec.height < 0.0));
  local_e8 = y_02;
  if ((byte)((byte)uVar3 >> 1) == 0) {
    local_e8 = (y_02 / (y_02 + local_68)) * fVar8;
    local_68 = fVar8 - local_e8;
  }
  fVar10 = fVar10 - fVar13;
  x = n_patch_info.source_rec.x / fVar7;
  y = fVar12 / fVar14;
  x_03 = (n_patch_info.source_rec.x + x_04) / fVar7;
  x_01 = ((n_patch_info.source_rec.width + n_patch_info.source_rec.x) - fVar13) / fVar7;
  fVar7 = (n_patch_info.source_rec.width + n_patch_info.source_rec.x) / fVar7;
  fVar13 = (n_patch_info.source_rec.height + fVar12) / fVar14;
  rf_gfx_enable_texture(texture.id);
  rf_gfx_push_matrix();
  local_58 = dest_rec.x;
  fStack_54 = dest_rec.y;
  rf_gfx_translatef(local_58,fStack_54,0.0);
  rf_gfx_rotatef(rotation,0.0,0.0,1.0);
  local_48 = origin.x;
  fStack_44 = origin.y;
  rf_gfx_translatef(-local_48,-fStack_44,0.0);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(tint.r,tint.g,tint.b,tint.a);
  if (n_patch_info.type == 2) {
    rf_gfx_tex_coord2f(x,fVar13);
    rf_gfx_vertex2f(0.0,n_patch_info.source_rec.height);
    rf_gfx_tex_coord2f(x_03,fVar13);
    rf_gfx_vertex2f(x_04,n_patch_info.source_rec.height);
    rf_gfx_tex_coord2f(x_03,y);
    rf_gfx_vertex2f(x_04,0.0);
    rf_gfx_tex_coord2f(x,y);
    rf_gfx_vertex2f(0.0,0.0);
    if ((uVar3 & 1) != 0) {
      rf_gfx_tex_coord2f(x_03,fVar13);
      rf_gfx_vertex2f(x_02,n_patch_info.source_rec.height);
      rf_gfx_tex_coord2f(x_01,fVar13);
      rf_gfx_vertex2f(fVar10,n_patch_info.source_rec.height);
      rf_gfx_tex_coord2f(x_01,y);
      rf_gfx_vertex2f(fVar10,0.0);
      rf_gfx_tex_coord2f(x_03,y);
      rf_gfx_vertex2f(x_02,0.0);
    }
    rf_gfx_tex_coord2f(x_01,fVar13);
    rf_gfx_vertex2f(fVar10,n_patch_info.source_rec.height);
    rf_gfx_tex_coord2f(fVar7,fVar13);
    rf_gfx_vertex2f(x_00,n_patch_info.source_rec.height);
    rf_gfx_tex_coord2f(fVar7,y);
    rf_gfx_vertex2f(x_00,0.0);
    rf_gfx_tex_coord2f(x_01,y);
    fVar8 = 0.0;
  }
  else {
    fVar8 = fVar8 - local_68;
    y_00 = (fVar12 + local_e8) / fVar14;
    fVar14 = ((n_patch_info.source_rec.height + fVar12) - local_68) / fVar14;
    if (n_patch_info.type == 1) {
      rf_gfx_tex_coord2f(x,y_00);
      rf_gfx_vertex2f(0.0,local_e8);
      rf_gfx_tex_coord2f(fVar7,y_00);
      rf_gfx_vertex2f(n_patch_info.source_rec.width,local_e8);
      rf_gfx_tex_coord2f(fVar7,y);
      rf_gfx_vertex2f(n_patch_info.source_rec.width,0.0);
      rf_gfx_tex_coord2f(x,y);
      rf_gfx_vertex2f(0.0,0.0);
      if ((uVar3 & 1) != 0) {
        rf_gfx_tex_coord2f(x,fVar14);
        rf_gfx_vertex2f(0.0,fVar8);
        rf_gfx_tex_coord2f(fVar7,fVar14);
        rf_gfx_vertex2f(n_patch_info.source_rec.width,fVar8);
        rf_gfx_tex_coord2f(fVar7,y_00);
        rf_gfx_vertex2f(n_patch_info.source_rec.width,local_e8);
        rf_gfx_tex_coord2f(x,y_00);
        rf_gfx_vertex2f(0.0,local_e8);
      }
      rf_gfx_tex_coord2f(x,fVar13);
      rf_gfx_vertex2f(0.0,y_01);
      rf_gfx_tex_coord2f(fVar7,fVar13);
      rf_gfx_vertex2f(n_patch_info.source_rec.width,y_01);
      rf_gfx_tex_coord2f(fVar7,fVar14);
      rf_gfx_vertex2f(n_patch_info.source_rec.width,fVar8);
      rf_gfx_tex_coord2f(x,fVar14);
      fVar10 = 0.0;
    }
    else {
      if (n_patch_info.type != 0) goto LAB_0014988b;
      rf_gfx_tex_coord2f(x,y_00);
      rf_gfx_vertex2f(0.0,local_e8);
      rf_gfx_tex_coord2f(x_03,y_00);
      rf_gfx_vertex2f(x_04,local_e8);
      rf_gfx_tex_coord2f(x_03,y);
      rf_gfx_vertex2f(x_04,0.0);
      rf_gfx_tex_coord2f(x,y);
      rf_gfx_vertex2f(0.0,0.0);
      if ((uVar3 & 1) != 0) {
        rf_gfx_tex_coord2f(x_03,y_00);
        rf_gfx_vertex2f(x_02,local_e8);
        rf_gfx_tex_coord2f(x_01,y_00);
        rf_gfx_vertex2f(fVar10,local_e8);
        rf_gfx_tex_coord2f(x_01,y);
        rf_gfx_vertex2f(fVar10,0.0);
        rf_gfx_tex_coord2f(x_03,y);
        rf_gfx_vertex2f(x_02,0.0);
      }
      rf_gfx_tex_coord2f(x_01,y_00);
      rf_gfx_vertex2f(fVar10,local_e8);
      rf_gfx_tex_coord2f(fVar7,y_00);
      rf_gfx_vertex2f(x_00,local_e8);
      rf_gfx_tex_coord2f(fVar7,y);
      rf_gfx_vertex2f(x_00,0.0);
      rf_gfx_tex_coord2f(x_01,y);
      rf_gfx_vertex2f(fVar10,0.0);
      if ((byte)((byte)uVar3 >> 1) != 0) {
        rf_gfx_tex_coord2f(x,fVar14);
        rf_gfx_vertex2f(0.0,fVar8);
        rf_gfx_tex_coord2f(x_03,fVar14);
        rf_gfx_vertex2f(x_04,fVar8);
        rf_gfx_tex_coord2f(x_03,y_00);
        rf_gfx_vertex2f(x_04,y_02);
        rf_gfx_tex_coord2f(x,y_00);
        rf_gfx_vertex2f(0.0,y_02);
        if ((uVar3 & 1) != 0) {
          rf_gfx_tex_coord2f(x_03,fVar14);
          rf_gfx_vertex2f(x_02,fVar8);
          rf_gfx_tex_coord2f(x_01,fVar14);
          rf_gfx_vertex2f(fVar10,fVar8);
          rf_gfx_tex_coord2f(x_01,y_00);
          rf_gfx_vertex2f(fVar10,y_02);
          rf_gfx_tex_coord2f(x_03,y_00);
          rf_gfx_vertex2f(x_02,y_02);
        }
        rf_gfx_tex_coord2f(x_01,fVar14);
        rf_gfx_vertex2f(fVar10,fVar8);
        rf_gfx_tex_coord2f(fVar7,fVar14);
        rf_gfx_vertex2f(x_00,fVar8);
        rf_gfx_tex_coord2f(fVar7,y_00);
        rf_gfx_vertex2f(x_00,y_02);
        rf_gfx_tex_coord2f(x_01,y_00);
        rf_gfx_vertex2f(fVar10,y_02);
      }
      rf_gfx_tex_coord2f(x,fVar13);
      rf_gfx_vertex2f(0.0,y_01);
      rf_gfx_tex_coord2f(x_03,fVar13);
      rf_gfx_vertex2f(x_04,y_01);
      rf_gfx_tex_coord2f(x_03,fVar14);
      rf_gfx_vertex2f(x_04,fVar8);
      rf_gfx_tex_coord2f(x,fVar14);
      rf_gfx_vertex2f(0.0,fVar8);
      if ((uVar3 & 1) != 0) {
        rf_gfx_tex_coord2f(x_03,fVar13);
        rf_gfx_vertex2f(x_02,y_01);
        rf_gfx_tex_coord2f(x_01,fVar13);
        rf_gfx_vertex2f(fVar10,y_01);
        rf_gfx_tex_coord2f(x_01,fVar14);
        rf_gfx_vertex2f(fVar10,fVar8);
        rf_gfx_tex_coord2f(x_03,fVar14);
        rf_gfx_vertex2f(x_02,fVar8);
      }
      rf_gfx_tex_coord2f(x_01,fVar13);
      rf_gfx_vertex2f(fVar10,y_01);
      rf_gfx_tex_coord2f(fVar7,fVar13);
      rf_gfx_vertex2f(x_00,y_01);
      rf_gfx_tex_coord2f(fVar7,fVar14);
      rf_gfx_vertex2f(x_00,fVar8);
      rf_gfx_tex_coord2f(x_01,fVar14);
    }
  }
  rf_gfx_vertex2f(fVar10,fVar8);
LAB_0014988b:
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_texture_npatch(rf_texture2d texture, rf_npatch_info n_patch_info, rf_rec dest_rec, rf_vec2 origin, float rotation, rf_color tint)
{
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        float patch_width = (dest_rec.width <= 0.0f)? 0.0f : dest_rec.width;
        float patch_height = (dest_rec.height <= 0.0f)? 0.0f : dest_rec.height;

        if (n_patch_info.source_rec.width < 0) n_patch_info.source_rec.x -= n_patch_info.source_rec.width;
        if (n_patch_info.source_rec.height < 0) n_patch_info.source_rec.y -= n_patch_info.source_rec.height;
        if (n_patch_info.type == RF_NPT_3PATCH_HORIZONTAL) patch_height = n_patch_info.source_rec.height;
        if (n_patch_info.type == RF_NPT_3PATCH_VERTICAL) patch_width = n_patch_info.source_rec.width;

        bool draw_center = true;
        bool draw_middle = true;
        float left_border = (float)n_patch_info.left;
        float top_border = (float)n_patch_info.top;
        float right_border = (float)n_patch_info.right;
        float bottom_border = (float)n_patch_info.bottom;

        // adjust the lateral (left and right) border widths in case patch_width < texture.width
        if (patch_width <= (left_border + right_border) && n_patch_info.type != RF_NPT_3PATCH_VERTICAL)
        {
            draw_center = false;
            left_border = (left_border / (left_border + right_border)) * patch_width;
            right_border = patch_width - left_border;
        }
        // adjust the lateral (top and bottom) border heights in case patch_height < texture.height
        if (patch_height <= (top_border + bottom_border) && n_patch_info.type != RF_NPT_3PATCH_HORIZONTAL)
        {
            draw_middle = false;
            top_border = (top_border / (top_border + bottom_border)) * patch_height;
            bottom_border = patch_height - top_border;
        }

        rf_vec2 vert_a, vert_b, vert_c, vert_d;
        vert_a.x = 0.0f; // outer left
        vert_a.y = 0.0f; // outer top
        vert_b.x = left_border; // inner left
        vert_b.y = top_border; // inner top
        vert_c.x = patch_width - right_border; // inner right
        vert_c.y = patch_height - bottom_border; // inner bottom
        vert_d.x = patch_width; // outer right
        vert_d.y = patch_height; // outer bottom

        rf_vec2 coord_a, coord_b, coord_c, coord_d;
        coord_a.x = n_patch_info.source_rec.x / width;
        coord_a.y = n_patch_info.source_rec.y / height;
        coord_b.x = (n_patch_info.source_rec.x + left_border) / width;
        coord_b.y = (n_patch_info.source_rec.y + top_border) / height;
        coord_c.x = (n_patch_info.source_rec.x + n_patch_info.source_rec.width - right_border) / width;
        coord_c.y = (n_patch_info.source_rec.y + n_patch_info.source_rec.height - bottom_border) / height;
        coord_d.x = (n_patch_info.source_rec.x + n_patch_info.source_rec.width) / width;
        coord_d.y = (n_patch_info.source_rec.y + n_patch_info.source_rec.height) / height;

        rf_gfx_enable_texture(texture.id);

        rf_gfx_push_matrix();
        rf_gfx_translatef(dest_rec.x, dest_rec.y, 0.0f);
        rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
        rf_gfx_translatef(-origin.x, -origin.y, 0.0f);

        rf_gfx_begin(RF_QUADS);
        rf_gfx_color4ub(tint.r, tint.g, tint.b, tint.a);
        rf_gfx_normal3f(0.0f, 0.0f, 1.0f); // Normal vector pointing towards viewer

        if (n_patch_info.type == RF_NPT_9PATCH)
        {
            // ------------------------------------------------------------
            // TOP-LEFT QUAD
            rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_a.y); rf_gfx_vertex2f(vert_a.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // TOP-CENTER QUAD
                rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-left corner for texture and quad
            }
            // TOP-RIGHT QUAD
            rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_a.y); rf_gfx_vertex2f(vert_d.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_middle)
            {
                // ------------------------------------------------------------
                // MIDDLE-LEFT QUAD
                rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Top-left corner for texture and quad
                if (draw_center)
                {
                    // MIDDLE-CENTER QUAD
                    rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Bottom-left corner for texture and quad
                    rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Bottom-right corner for texture and quad
                    rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Top-right corner for texture and quad
                    rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Top-left corner for texture and quad
                }

                // MIDDLE-RIGHT QUAD
                rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Top-left corner for texture and quad
            }

            // ------------------------------------------------------------
            // BOTTOM-LEFT QUAD
            rf_gfx_tex_coord2f(coord_a.x, coord_d.y); rf_gfx_vertex2f(vert_a.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // BOTTOM-CENTER QUAD
                rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Top-left corner for texture and quad
            }

            // BOTTOM-RIGHT QUAD
            rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_d.y); rf_gfx_vertex2f(vert_d.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Top-left corner for texture and quad
        }
        else if (n_patch_info.type == RF_NPT_3PATCH_VERTICAL)
        {
            // TOP QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_a.y); rf_gfx_vertex2f(vert_d.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_a.y); rf_gfx_vertex2f(vert_a.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // MIDDLE QUAD
                // -----------------------------------------------------------
                // rf_texture coords                 Vertices
                rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Top-left corner for texture and quad
            }
            // BOTTOM QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_a.x, coord_d.y); rf_gfx_vertex2f(vert_a.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_d.y); rf_gfx_vertex2f(vert_d.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Top-left corner for texture and quad
        }
        else if (n_patch_info.type == RF_NPT_3PATCH_HORIZONTAL)
        {
            // LEFT QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_a.x, coord_d.y); rf_gfx_vertex2f(vert_a.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_a.y); rf_gfx_vertex2f(vert_a.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // CENTER QUAD
                // -----------------------------------------------------------
                // rf_texture coords                 Vertices
                rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-left corner for texture and quad
            }
            // RIGHT QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_d.y); rf_gfx_vertex2f(vert_d.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_a.y); rf_gfx_vertex2f(vert_d.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-left corner for texture and quad
        }
        rf_gfx_end();
        rf_gfx_pop_matrix();

        rf_gfx_disable_texture();

    }
}